

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O3

void prf_model_destroy(prf_model_t *model)

{
  uint uVar1;
  ulong uVar2;
  prf_cb_t callback;
  
  if (model->header != (prf_node_t *)0x0) {
    callback.data = model;
    callback.func = destroy_cb;
    prf_model_traverse_df(model,callback);
  }
  if (model->mempool_id != 0) {
    pool_destroy(model->mempool_id);
  }
  if (model->vertextras != (prf_vertex_pool_s **)0x0) {
    uVar1 = prf_array_count(model->vertextras);
    if (0 < (int)uVar1) {
      uVar2 = 0;
      do {
        free(model->vertextras[uVar2]->data);
        free(model->vertextras[uVar2]);
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
    }
    prf_array_free(model->vertextras);
  }
  free(model);
  return;
}

Assistant:

void
prf_model_destroy(
    prf_model_t * model )
{
    assert( model != NULL );

    if ( model->header != NULL ) {
        prf_cb_t traverseCB;
        prf_cb_set( traverseCB, destroy_cb, model );
        prf_model_traverse_df( model, traverseCB );
    }

    if ( model->mempool_id != 0 )
        pool_destroy( model->mempool_id );

    if ( model->vertextras != NULL )
        prf_vertextras_exit( model );

    free( model );
}